

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSimpleRecurrentLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint64_t uVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  WeightParamType WVar5;
  SimpleRecurrentLayerParams *pSVar6;
  WeightParams *pWVar7;
  string *psVar8;
  uint64 uVar9;
  uint64 uVar10;
  ActivationParams *params_00;
  allocator local_3a9;
  string local_3a8;
  allocator local_381;
  string local_380;
  Result local_360;
  allocator local_331;
  string local_330;
  allocator local_309;
  string local_308;
  Result local_2e8;
  uint64_t local_2c0;
  uint64_t recurrent_matrix_size;
  string local_2b0;
  allocator local_289;
  string local_288;
  Result local_268;
  uint64_t local_240;
  uint64_t input_matrix_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  string err;
  WeightParamType biasVectorValueType;
  WeightParamType recursionMatrixValueType;
  WeightParamType weightMatrixValueType;
  bool hasBiasVector;
  SimpleRecurrentLayerParams *params;
  string local_148;
  Result local_128;
  allocator local_f9;
  string local_f8;
  Result local_d8;
  undefined4 local_ac;
  Result local_a8;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,2,2);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar3 = Result::good((Result *)local_48);
  if (bVar3) {
    validateOutputCount(&local_a8,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,2,2);
    Result::operator=((Result *)local_48,&local_a8);
    Result::~Result(&local_a8);
  }
  bVar3 = Result::good((Result *)local_48);
  if (bVar3) {
    bVar3 = Result::good((Result *)local_48);
    uVar2 = r.m_message.field_2._8_8_;
    if (bVar3) {
      if ((this->ndArrayInterpretation & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f8,"SimpleRecurrent",&local_f9);
        validateInputOutputRankEquality
                  (&local_d8,(NeuralNetworkLayer *)uVar2,&local_f8,&this->blobNameToRank);
        Result::operator=((Result *)local_48,&local_d8);
        Result::~Result(&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        bVar3 = Result::good((Result *)local_48);
        uVar2 = r.m_message.field_2._8_8_;
        if (!bVar3) {
          Result::Result(__return_storage_ptr__,(Result *)local_48);
          local_ac = 1;
          goto LAB_00a28b5d;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_148,"SimpleRecurrent",(allocator *)((long)&params + 7));
        validateRankCount(&local_128,(NeuralNetworkLayer *)uVar2,&local_148,5,5,
                          &this->blobNameToRank);
        Result::operator=((Result *)local_48,&local_128);
        Result::~Result(&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
        bVar3 = Result::good((Result *)local_48);
        if (!bVar3) {
          Result::Result(__return_storage_ptr__,(Result *)local_48);
          local_ac = 1;
          goto LAB_00a28b5d;
        }
      }
      pSVar6 = Specification::NeuralNetworkLayer::simplerecurrent
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      bVar3 = Specification::SimpleRecurrentLayerParams::hasbiasvector(pSVar6);
      pWVar7 = Specification::SimpleRecurrentLayerParams::weightmatrix(pSVar6);
      WVar5 = valueType(pWVar7);
      pWVar7 = Specification::SimpleRecurrentLayerParams::recursionmatrix(pSVar6);
      err.field_2._12_4_ = valueType(pWVar7);
      pWVar7 = Specification::SimpleRecurrentLayerParams::biasvector(pSVar6);
      err.field_2._8_4_ = valueType(pWVar7);
      if (((WVar5 == UNSPECIFIED) || (err.field_2._12_4_ == 4)) ||
         ((bVar3 && (err.field_2._8_4_ == UNSPECIFIED)))) {
        psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::operator+(&local_1a8,"Simple recurrent layer \'",psVar8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_188,&local_1a8,
                       "\' has invalid weightMatrix/recusionMatrix/Bias fields.");
        std::__cxx11::string::~string((string *)&local_1a8);
        Result::Result((Result *)((long)&err_1.field_2 + 8),INVALID_MODEL_PARAMETERS,
                       (string *)local_188);
        Result::operator=((Result *)local_48,(Result *)((long)&err_1.field_2 + 8));
        Result::~Result((Result *)((long)&err_1.field_2 + 8));
        Result::Result(__return_storage_ptr__,(Result *)local_48);
        local_ac = 1;
        std::__cxx11::string::~string((string *)local_188);
      }
      else if (((WVar5 == QUINT) || (err.field_2._12_4_ == 2)) ||
              ((WVar5 == err.field_2._12_4_ &&
               (((!bVar3 || (err.field_2._8_4_ == QUINT)) || (WVar5 == err.field_2._8_4_)))))) {
        uVar9 = Specification::SimpleRecurrentLayerParams::inputvectorsize(pSVar6);
        uVar10 = Specification::SimpleRecurrentLayerParams::outputvectorsize(pSVar6);
        local_240 = uVar9 * uVar10;
        pWVar7 = Specification::SimpleRecurrentLayerParams::weightmatrix(pSVar6);
        uVar1 = local_240;
        uVar9 = Specification::SimpleRecurrentLayerParams::outputvectorsize(pSVar6);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_288,"SimpleRNN",&local_289);
        psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2b0,"WeightMatrix",
                   (allocator *)((long)&recurrent_matrix_size + 7));
        validateGeneralWeightParams(&local_268,pWVar7,uVar1,uVar9,&local_288,psVar8,&local_2b0);
        Result::operator=((Result *)local_48,&local_268);
        Result::~Result(&local_268);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&recurrent_matrix_size + 7));
        std::__cxx11::string::~string((string *)&local_288);
        std::allocator<char>::~allocator((allocator<char> *)&local_289);
        bVar4 = Result::good((Result *)local_48);
        if (bVar4) {
          uVar9 = Specification::SimpleRecurrentLayerParams::outputvectorsize(pSVar6);
          uVar10 = Specification::SimpleRecurrentLayerParams::outputvectorsize(pSVar6);
          local_2c0 = uVar9 * uVar10;
          pWVar7 = Specification::SimpleRecurrentLayerParams::recursionmatrix(pSVar6);
          uVar1 = local_2c0;
          uVar9 = Specification::SimpleRecurrentLayerParams::outputvectorsize(pSVar6);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_308,"SimpleRNN",&local_309);
          psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                             ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_330,"RecursionMatrix",&local_331);
          validateGeneralWeightParams(&local_2e8,pWVar7,uVar1,uVar9,&local_308,psVar8,&local_330);
          Result::operator=((Result *)local_48,&local_2e8);
          Result::~Result(&local_2e8);
          std::__cxx11::string::~string((string *)&local_330);
          std::allocator<char>::~allocator((allocator<char> *)&local_331);
          std::__cxx11::string::~string((string *)&local_308);
          std::allocator<char>::~allocator((allocator<char> *)&local_309);
          bVar4 = Result::good((Result *)local_48);
          if (bVar4) {
            if (bVar3) {
              pWVar7 = Specification::SimpleRecurrentLayerParams::biasvector(pSVar6);
              uVar9 = Specification::SimpleRecurrentLayerParams::outputvectorsize(pSVar6);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_380,"SimpleRNN",&local_381);
              psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                 ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_3a8,"BiasVector",&local_3a9);
              validateGeneralWeightParams(&local_360,pWVar7,uVar9,1,&local_380,psVar8,&local_3a8);
              Result::operator=((Result *)local_48,&local_360);
              Result::~Result(&local_360);
              std::__cxx11::string::~string((string *)&local_3a8);
              std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
              std::__cxx11::string::~string((string *)&local_380);
              std::allocator<char>::~allocator((allocator<char> *)&local_381);
              bVar3 = Result::good((Result *)local_48);
              if (!bVar3) {
                Result::Result(__return_storage_ptr__,(Result *)local_48);
                local_ac = 1;
                goto LAB_00a28b5d;
              }
            }
            pSVar6 = Specification::NeuralNetworkLayer::simplerecurrent
                               ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
            params_00 = Specification::SimpleRecurrentLayerParams::activation(pSVar6);
            validateRecurrentActivationParams(__return_storage_ptr__,params_00);
            local_ac = 1;
          }
          else {
            Result::Result(__return_storage_ptr__,(Result *)local_48);
            local_ac = 1;
          }
        }
        else {
          Result::Result(__return_storage_ptr__,(Result *)local_48);
          local_ac = 1;
        }
      }
      else {
        psVar8 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::operator+(&local_210,"Simple recurrent layer \'",psVar8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f0,&local_210,
                       "\' has invalid weightMatrix/recusionMatrix/Bias fields. Field value types should match and should either be half or full precision."
                      );
        std::__cxx11::string::~string((string *)&local_210);
        Result::Result((Result *)&input_matrix_size,INVALID_MODEL_PARAMETERS,(string *)local_1f0);
        Result::operator=((Result *)local_48,(Result *)&input_matrix_size);
        Result::~Result((Result *)&input_matrix_size);
        Result::Result(__return_storage_ptr__,(Result *)local_48);
        local_ac = 1;
        std::__cxx11::string::~string((string *)local_1f0);
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
  }
LAB_00a28b5d:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSimpleRecurrentLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    // Must specify hidden state
    r = validateInputCount(layer, 2, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 2, 2);
    }
    if (!r.good()) {
        return r;
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "SimpleRecurrent", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "SimpleRecurrent", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.simplerecurrent();
    bool hasBiasVector = params.hasbiasvector();
    WeightParamType weightMatrixValueType, recursionMatrixValueType, biasVectorValueType;
    weightMatrixValueType = valueType(params.weightmatrix());
    recursionMatrixValueType = valueType(params.recursionmatrix());
    biasVectorValueType = valueType(params.biasvector());

    // Verify all weights are of valid type
    if((weightMatrixValueType == UNSPECIFIED) || recursionMatrixValueType == UNSPECIFIED || (hasBiasVector && biasVectorValueType == UNSPECIFIED)){
        std::string err = "Simple recurrent layer '" + layer.name() + "' has invalid weightMatrix/recusionMatrix/Bias fields.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    // Verify either weightMatrix, recursionMatrix, and biasVector are all FP32 or FP16, or one of them is quantized
    if (weightMatrixValueType != QUINT && recursionMatrixValueType != QUINT){
        if (weightMatrixValueType != recursionMatrixValueType ||
            (hasBiasVector && biasVectorValueType != QUINT && weightMatrixValueType != biasVectorValueType) ){
            std::string err = "Simple recurrent layer '" + layer.name() + "' has invalid weightMatrix/recusionMatrix/Bias fields. "
            "Field value types should match and should either be half or full precision.";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        }
    }

    // Check weight matrix size
    // input matrix
    uint64_t input_matrix_size = params.inputvectorsize() * params.outputvectorsize();
    r = validateGeneralWeightParams(params.weightmatrix(), input_matrix_size,
                                    params.outputvectorsize(),
                                    "SimpleRNN", layer.name(), "WeightMatrix");
    if (!r.good()) return r;
    // recurrent matrix
    uint64_t recurrent_matrix_size = params.outputvectorsize() * params.outputvectorsize();
    r = validateGeneralWeightParams(params.recursionmatrix(), recurrent_matrix_size,
                                    params.outputvectorsize(), "SimpleRNN",
                                    layer.name(), "RecursionMatrix");
    if (!r.good()) return r;
    // bias
    if (hasBiasVector){
        r = validateGeneralWeightParams(params.biasvector(), params.outputvectorsize(), 1,
                                        "SimpleRNN", layer.name(), "BiasVector");
        if (!r.good()) return r;
    }
    // Validate the activations as well
    return validateRecurrentActivationParams(layer.simplerecurrent().activation());

}